

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

int __thiscall
Fl_PostScript_Graphics_Driver::alpha_mask
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int w,int h,int D,int LD)

{
  short *psVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  uchar *puVar6;
  void *__s;
  void *__s_00;
  int iVar7;
  int iVar8;
  long lVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  short sVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  short sVar23;
  long lVar24;
  short sVar25;
  void *pvVar26;
  long lVar27;
  
  this->mask = (uchar *)0x0;
  if ((D - (D >> 0x1f) & 0xfffffffeU) != D) {
    return 0;
  }
  if (h < 1) {
    return 0;
  }
  iVar14 = D * w + LD;
  uVar4 = (ulong)(uint)w;
  iVar8 = 0;
  iVar17 = 0;
  bVar2 = false;
  bVar3 = false;
  while (w < 1) {
LAB_002080e1:
    iVar17 = iVar17 + 1;
    iVar8 = iVar8 + iVar14;
    if (iVar17 == h) {
      uVar11 = (uint)bVar2;
      if (!bVar2) {
        return uVar11;
      }
      if (bVar3) {
        iVar8 = w + 0xe;
        if (-1 < w + 7) {
          iVar8 = w + 7;
        }
        uVar11 = (iVar8 >> 3) * h;
        puVar6 = (uchar *)operator_new__((long)(int)uVar11);
        this->mask = puVar6;
        if (0 < (int)uVar11) {
          uVar22 = 0;
          do {
            this->mask[uVar22] = '\0';
            uVar22 = uVar22 + 1;
          } while (uVar11 != uVar22);
        }
        if (0 < h) {
          iVar20 = 0;
          iVar17 = D;
          do {
            if (0 < w) {
              uVar22 = 0;
              iVar18 = iVar17;
              do {
                if (data[(long)iVar18 + -1] != '\0') {
                  this->mask[(uVar22 >> 3 & 0x1fffffff) + (ulong)(uint)(iVar20 * (iVar8 >> 3))] =
                       this->mask[(uVar22 >> 3 & 0x1fffffff) + (ulong)(uint)(iVar20 * (iVar8 >> 3))]
                       | (byte)(1 << ((byte)uVar22 & 7));
                }
                uVar22 = uVar22 + 1;
                iVar18 = iVar18 + D;
              } while (uVar4 != uVar22);
            }
            iVar20 = iVar20 + 1;
            iVar17 = iVar17 + iVar14;
          } while (iVar20 != h);
        }
        this->mx = w;
        this->my = h;
        return 0;
      }
      return uVar11;
    }
  }
  bVar19 = true;
  uVar22 = 0;
LAB_00208077:
  iVar20 = ((int)uVar22 + 1) * D + iVar8;
  do {
    uVar22 = uVar22 + 1;
    if (data[(long)iVar20 + -1] == 0xff) {
      bVar3 = true;
    }
    else {
      if (data[(long)iVar20 + -1] != '\0') break;
      bVar2 = true;
    }
    iVar20 = iVar20 + D;
    if (uVar22 == uVar4) {
      if (!bVar19) goto LAB_002081d3;
      goto LAB_002080e1;
    }
  } while( true );
  bVar19 = false;
  if (uVar22 == uVar4) {
LAB_002081d3:
    uVar11 = w + 1U >> 1;
    uVar15 = h * 4 * uVar11;
    puVar6 = (uchar *)operator_new__((long)(int)uVar15);
    this->mask = puVar6;
    if (0 < (int)uVar15) {
      uVar22 = 0;
      do {
        this->mask[uVar22] = '\0';
        uVar22 = uVar22 + 1;
      } while (uVar15 != uVar22);
    }
    this->mx = w * 4;
    this->my = h * 4;
    iVar8 = w * 4 + 2;
    __s = operator_new__((long)iVar8 * 2);
    __s_00 = operator_new__((long)iVar8 * 2);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    memset(__s_00,0,(ulong)(uint)(iVar8 * 2));
    memset(__s,0,(ulong)(uint)(iVar8 * 2));
    iVar8 = 0;
    do {
      iVar17 = iVar8 * iVar14 + D;
      uVar15 = 0;
      bVar2 = true;
      do {
        bVar3 = bVar2;
        *(undefined2 *)((long)__s + 2) = 0;
        if (w < 1) {
          *(undefined2 *)((long)__s_00 + 2) = 0;
        }
        else {
          bVar5 = 0;
          uVar22 = 0;
          lVar9 = (long)__s_00 + 4;
          pvVar26 = __s;
          do {
            lVar24 = 0;
            do {
              sVar25 = (ushort)data[(long)((int)uVar22 * D + iVar17) + -1] +
                       *(short *)(lVar9 + -2 + lVar24 * 2);
              if (0x7f < sVar25) {
                this->mask
                [(ulong)((uint)(uVar22 >> 1) & 0x1fffffff) + (ulong)((uVar15 | iVar8 * 4) * uVar11)]
                     = this->mask
                       [(ulong)((uint)(uVar22 >> 1) & 0x1fffffff) +
                        (ulong)((uVar15 | iVar8 * 4) * uVar11)] |
                       '\x01' << ((bVar5 & 7) + (char)lVar24 & 0x1f);
                sVar25 = sVar25 + -0xff;
              }
              iVar7 = (int)sVar25;
              iVar18 = iVar7 * 7;
              iVar20 = iVar7 * 3;
              sVar13 = *(short *)((long)pvVar26 + lVar24 * 2);
              if (sVar25 < 1) {
                iVar12 = iVar20 + 7;
                if (-1 < iVar20 + -8) {
                  iVar12 = iVar20 + -8;
                }
                sVar10 = (short)(iVar12 >> 4);
                iVar20 = iVar18 + 7;
                if (-1 < iVar18 + -8) {
                  iVar20 = iVar18 + -8;
                }
                psVar1 = (short *)(lVar9 + lVar24 * 2);
                sVar23 = (short)(iVar20 >> 4);
                *psVar1 = *psVar1 + sVar23;
                *(short *)((long)pvVar26 + lVar24 * 2) = sVar13 + sVar10;
                uVar16 = iVar7 + 7;
                if (-1 < (int)(iVar7 - 8U)) {
                  uVar16 = iVar7 - 8U;
                }
              }
              else {
                sVar10 = (short)(iVar20 + 8U >> 4);
                psVar1 = (short *)(lVar9 + lVar24 * 2);
                sVar23 = (short)(iVar18 + 8U >> 4);
                *psVar1 = *psVar1 + sVar23;
                *(short *)((long)pvVar26 + lVar24 * 2) = sVar13 + sVar10;
                uVar16 = (uint)(ushort)(sVar25 + 8);
              }
              sVar13 = (short)(uVar16 >> 4);
              *(short *)((long)pvVar26 + lVar24 * 2 + 4) = sVar13;
              psVar1 = (short *)((long)pvVar26 + lVar24 * 2 + 2);
              *psVar1 = *psVar1 + (sVar25 - (sVar13 + sVar10 + sVar23));
              lVar24 = lVar24 + 1;
            } while (lVar24 != 4);
            uVar22 = uVar22 + 1;
            bVar5 = (bVar5 & 7) + 4;
            pvVar26 = (void *)((long)pvVar26 + 8);
            lVar9 = lVar9 + 8;
          } while (uVar22 != uVar4);
          *(undefined2 *)((long)__s_00 + 2) = 0;
          if (0 < w) {
            lVar9 = (long)__s + uVar4 * 8 + -2;
            lVar24 = uVar4 * 8 + 2 + (long)__s_00;
            uVar22 = uVar4;
            uVar16 = w * 4 - 4U | 3;
            do {
              lVar27 = 0;
              do {
                sVar25 = (ushort)data[(long)((int)(uVar22 - 1) * D + iVar17) + -1] +
                         *(short *)(lVar9 + 2 + lVar27 * 2);
                if (0x7f < sVar25) {
                  uVar21 = uVar16 + (int)lVar27;
                  this->mask[(ulong)(uVar21 >> 3) + (ulong)((iVar8 * 4 + uVar15 + 1) * uVar11)] =
                       this->mask[(ulong)(uVar21 >> 3) + (ulong)((iVar8 * 4 + uVar15 + 1) * uVar11)]
                       | (byte)(1 << ((byte)uVar21 & 7));
                  sVar25 = sVar25 + -0xff;
                }
                iVar7 = (int)sVar25;
                iVar18 = iVar7 * 7;
                iVar20 = iVar7 * 3;
                sVar13 = *(short *)(lVar24 + lVar27 * 2);
                if (sVar25 < 1) {
                  iVar12 = iVar20 + 7;
                  if (-1 < iVar20 + -8) {
                    iVar12 = iVar20 + -8;
                  }
                  sVar10 = (short)(iVar12 >> 4);
                  iVar20 = iVar18 + 7;
                  if (-1 < iVar18 + -8) {
                    iVar20 = iVar18 + -8;
                  }
                  psVar1 = (short *)(lVar9 + lVar27 * 2);
                  sVar23 = (short)(iVar20 >> 4);
                  *psVar1 = *psVar1 + sVar23;
                  *(short *)(lVar24 + lVar27 * 2) = sVar13 + sVar10;
                  uVar21 = iVar7 + 7;
                  if (-1 < (int)(iVar7 - 8U)) {
                    uVar21 = iVar7 - 8U;
                  }
                }
                else {
                  sVar10 = (short)(iVar20 + 8U >> 4);
                  psVar1 = (short *)(lVar9 + lVar27 * 2);
                  sVar23 = (short)(iVar18 + 8U >> 4);
                  *psVar1 = *psVar1 + sVar23;
                  *(short *)(lVar24 + lVar27 * 2) = sVar13 + sVar10;
                  uVar21 = iVar7 + 8U & 0xffff;
                }
                sVar13 = (short)(uVar21 >> 4);
                *(short *)(lVar24 + -4 + lVar27 * 2) = sVar13;
                psVar1 = (short *)(lVar24 + -2 + lVar27 * 2);
                *psVar1 = *psVar1 + (sVar25 - (sVar13 + sVar10 + sVar23));
                lVar27 = lVar27 + -1;
              } while (lVar27 != -4);
              lVar24 = lVar24 + -8;
              uVar16 = uVar16 - 4;
              lVar9 = lVar9 + -8;
              bVar2 = 1 < (long)uVar22;
              uVar22 = uVar22 - 1;
            } while (bVar2);
          }
        }
        uVar15 = 2;
        bVar2 = false;
      } while (bVar3);
      iVar8 = iVar8 + 1;
    } while (iVar8 != h);
    operator_delete__(__s);
    operator_delete__(__s_00);
    return 0;
  }
  goto LAB_00208077;
}

Assistant:

int Fl_PostScript_Graphics_Driver::alpha_mask(const uchar * data, int w, int h, int D, int LD){

  mask = 0;
  if ((D/2)*2 != D){ //no mask info
    return 0;
  }
  int xx;
  int i,j, k, l;
  LD += w*D;
  int V255=0;
  int V0 =0;
  int V_=0;
  for (j=0;j<h;j++){
    for (i=0;i<w;i++)
      switch(data[j*LD+D*i+D-1]){
        case 255: V255 = 1; break;
        case 0: V0 = 1; break;
        default: V_= 1;
      }
    if (V_) break;
  };
  if (!V_){
    if (V0)
      if (V255){// not true alpha, only masking
        xx = (w+7)/8;
        mask = new uchar[h * xx];
        for (i=0;i<h * xx;i++) mask[i]=0;
        for (j=0;j<h;j++)
          for (i=0;i<w;i++)
            if (data[j*LD+D*i+D-1])
              mask[j*xx+i/8] |= 1 << (i % 8);
        mx = w;
        my = h; //mask imensions
        return 0;
      } else {
        mask=0;
        return 1; //everything masked
      }
    else
      return 0;
  }



  /////   Alpha dither, generating (4*w) * 4 mask area       /////
  /////         with Floyd-Steinberg error diffusion         /////

  mask = new uchar[((w+1)/2) * h * 4];

  for (i = 0; i<((w+1)/2) * h * 4; i++) mask[i] = 0; //cleaning



  mx= w*4;
  my=h*4; // mask dimensions

  xx = (w+1)/2;                //  mask line width in bytes

  short * errors1 = new short [w*4+2]; //  two rows of dither errors
  short * errors2 = new short [w*4+2]; //  two rows of dither errors

  for (i=0; i<w*4+2; i++) errors2[i] = 0; // cleaning,after first swap will become current
  for (i=0; i<w*4+2; i++) errors1[i] = 0; // cleaning,after first swap will become current

  short * current = errors1;
  short * next = errors2;
  short * swap;

  for (j=0; j<h; j++){
    for (l=0; l<4; ){           // generating 4 rows of mask lines for 1 RGB line
      int jj = j*4+l;

      /// mask row index
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1
      for (i=0; i<w; i++){
        for (k=0; k<4; k++){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;
          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){
            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          }else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii] +=  o1 = (error * 3 + 8)/16;
            current[ii+2] += o2 = (error * 7 + 8)/16;
            next[ii+2] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii] += o1 = (error * 3 - 8)/16;
            current[ii+2] += o2 = (error * 7 - 8)/16;
            next[ii+2] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;

      ////// backward

      jj = j*4+l;
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1

      for (i = w-1; i >= 0; i--){

        for (k=3; k>=0; k--){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;

          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){

            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          } else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii+2] +=  o1 = (error * 3 + 8)/16;
            current[ii] += o2 = (error * 7 + 8)/16;
            next[ii] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii+2] += o1 = (error * 3 - 8)/16;

            current[ii] += o2 = (error * 7 - 8)/16;
            next[ii] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;
    }
  }
  delete[] errors1;
  delete[] errors2;
  return 0;
}